

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

VP8LHistogram * VP8LAllocateHistogram(int cache_bits)

{
  int iVar1;
  VP8LHistogram *pVVar2;
  
  iVar1 = (4 << ((byte)cache_bits & 0x1f)) + 0x1138;
  if (cache_bits < 1) {
    iVar1 = 0x1138;
  }
  pVVar2 = (VP8LHistogram *)WebPSafeMalloc((long)iVar1,1);
  if (pVVar2 == (VP8LHistogram *)0x0) {
    pVVar2 = (VP8LHistogram *)0x0;
  }
  else {
    pVVar2->literal_ = (uint32_t *)(pVVar2 + 1);
    pVVar2->palette_code_bits_ = cache_bits;
    *(undefined8 *)&pVVar2->trivial_symbol_ = 0;
    *(undefined8 *)((long)&pVVar2->bit_cost_ + 4) = 0;
    *(undefined8 *)((long)&pVVar2->literal_cost_ + 4) = 0;
    *(undefined8 *)((long)&pVVar2->red_cost_ + 4) = 0;
    *(undefined8 *)((long)&pVVar2->red_cost_ + 5) = 0;
    *(undefined8 *)((long)&pVVar2->blue_cost_ + 5) = 0;
  }
  return pVVar2;
}

Assistant:

VP8LHistogram* VP8LAllocateHistogram(int cache_bits) {
  VP8LHistogram* histo = NULL;
  const int total_size = GetHistogramSize(cache_bits);
  uint8_t* const memory = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*memory));
  if (memory == NULL) return NULL;
  histo = (VP8LHistogram*)memory;
  // literal_ won't necessary be aligned.
  histo->literal_ = (uint32_t*)(memory + sizeof(VP8LHistogram));
  VP8LHistogramInit(histo, cache_bits, /*init_arrays=*/ 0);
  return histo;
}